

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::FenceVkImpl::~FenceVkImpl(FenceVkImpl *this)

{
  undefined *puVar1;
  bool bVar2;
  Char *Message;
  size_type sVar3;
  char *pcVar4;
  undefined8 uVar5;
  char (*in_RCX) [21];
  char **in_R9;
  undefined1 local_80 [8];
  string _msg_1;
  size_type local_58;
  undefined1 local_50 [8];
  string _msg;
  string msg;
  FenceVkImpl *this_local;
  
  bVar2 = IsTimelineSemaphore(this);
  if (bVar2) {
    bVar2 = std::
            deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
            ::empty(&this->m_SyncPoints);
    if (!bVar2) {
      FormatString<char[26],char[21]>
                ((string *)((long)&_msg.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_SyncPoints.empty()",in_RCX);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"~FenceVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                 ,0x53);
      std::__cxx11::string::~string((string *)(_msg.field_2._M_local_buf + 8));
    }
    RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
    ::
    SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>,void>
              ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                *)(this->super_FenceBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                  .m_pDevice,&this->m_TimelineSemaphore,0xffffffffffffffff);
  }
  else {
    bVar2 = std::
            deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
            ::empty(&this->m_SyncPoints);
    if (!bVar2) {
      local_58 = std::
                 deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                 ::size(&this->m_SyncPoints);
      sVar3 = std::
              deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
              ::size(&this->m_SyncPoints);
      pcVar4 = "fence.";
      if (1 < sVar3) {
        pcVar4 = "fences.";
      }
      _msg_1.field_2._8_8_ = pcVar4;
      FormatString<char[42],unsigned_long,char[17],char_const*>
                ((string *)local_50,(Diligent *)"FenceVkImpl::~FenceVkImpl(): waiting for ",
                 (char (*) [42])&local_58,(unsigned_long *)" pending Vulkan ",
                 (char (*) [17])((long)&_msg_1.field_2 + 8),in_R9);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar5 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(0,uVar5,0);
      }
      std::__cxx11::string::~string((string *)local_50);
      Wait(this,0xffffffffffffffff);
    }
  }
  if (0x10 < this->m_MaxSyncPoints) {
    FormatString<char[152]>
              ((string *)local_80,
               (char (*) [152])
               "Max queue size of pending fences is too big. This may indicate that none of the GetCompletedValue(), Wait() or ExtractSignalSemaphore() have been used."
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar5 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(1,uVar5,0);
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  std::
  deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
  ::~deque(&this->m_SyncPoints);
  VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>::
  ~VulkanObjectWrapper(&this->m_TimelineSemaphore);
  FenceBase<Diligent::EngineVkImplTraits>::~FenceBase
            (&this->super_FenceBase<Diligent::EngineVkImplTraits>);
  return;
}

Assistant:

FenceVkImpl::~FenceVkImpl()
{
    if (IsTimelineSemaphore())
    {
        VERIFY_EXPR(m_SyncPoints.empty());
        m_pDevice->SafeReleaseDeviceObject(std::move(m_TimelineSemaphore), ~0ull);
    }
    else if (!m_SyncPoints.empty())
    {
        LOG_INFO_MESSAGE("FenceVkImpl::~FenceVkImpl(): waiting for ", m_SyncPoints.size(), " pending Vulkan ",
                         (m_SyncPoints.size() > 1 ? "fences." : "fence."));
        // Vulkan spec states that all queue submission commands that refer to
        // a fence must have completed execution before the fence is destroyed.
        // (https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-vkDestroyFence-fence-01120)
        Wait(UINT64_MAX);
    }

#ifdef DILIGENT_DEVELOPMENT
    if (m_MaxSyncPoints > RequiredArraySize * 2)
        LOG_WARNING_MESSAGE("Max queue size of pending fences is too big. This may indicate that none of the GetCompletedValue(), Wait() or ExtractSignalSemaphore() have been used.");
#endif
}